

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent_mmap.c
# Opt level: O3

void * duckdb_je_extent_alloc_mmap
                 (void *new_addr,size_t size,size_t alignment,_Bool *zero,_Bool *commit)

{
  void *pvVar1;
  
  pvVar1 = duckdb_je_pages_map(new_addr,size,alignment,commit);
  if ((pvVar1 != (void *)0x0) && (*commit == true)) {
    *zero = true;
  }
  return pvVar1;
}

Assistant:

void *
extent_alloc_mmap(void *new_addr, size_t size, size_t alignment, bool *zero,
    bool *commit) {
	assert(alignment == ALIGNMENT_CEILING(alignment, PAGE));
	void *ret = pages_map(new_addr, size, alignment, commit);
	if (ret == NULL) {
		return NULL;
	}
	assert(ret != NULL);
	if (*commit) {
		*zero = true;
	}
	return ret;
}